

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MessageQueue.cpp
# Opt level: O0

void __thiscall
f8n::runtime::MessageQueue::Enqueue(MessageQueue *this,IMessagePtr *message,int64_t delayMs)

{
  bool bVar1;
  long *plVar2;
  EnqueuedMessage *this_00;
  type tVar3;
  size_type sVar4;
  atomic<long> *paVar5;
  reference ppEVar6;
  _List_iterator<f8n::runtime::MessageQueue::EnqueuedMessage_*> local_b8;
  _List_node_base *local_b0;
  const_iterator local_a8;
  _Self local_a0;
  byte local_91;
  _Self _Stack_90;
  bool first;
  _Self local_88;
  _Self local_80;
  Iterator curr;
  EnqueuedMessage *local_68;
  EnqueuedMessage *m;
  duration<long,_std::ratio<1L,_1000000000L>_> local_58;
  duration<long,_std::ratio<1L,_1000L>_> local_50;
  milliseconds now;
  int64_t local_40;
  int64_t delayMs_local;
  IMessagePtr *message_local;
  MessageQueue *this_local;
  memory_order local_20;
  int local_1c;
  memory_order __b;
  atomic<long> *local_10;
  
  now.__r = 0;
  local_40 = delayMs;
  delayMs_local = (int64_t)message;
  message_local = (IMessagePtr *)this;
  plVar2 = std::max<long>(&now.__r,&local_40);
  local_40 = *plVar2;
  m = (EnqueuedMessage *)std::chrono::_V2::system_clock::now();
  local_58.__r = (rep)std::chrono::
                      time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                      ::time_since_epoch((time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                                          *)&m);
  local_50.__r = (rep)std::chrono::
                      duration_cast<std::chrono::duration<long,std::ratio<1l,1000l>>,long,std::ratio<1l,1000000000l>>
                                (&local_58);
  this_00 = (EnqueuedMessage *)operator_new(0x18);
  memset(this_00,0,0x18);
  EnqueuedMessage::EnqueuedMessage(this_00);
  local_68 = this_00;
  std::shared_ptr<f8n::runtime::IMessage>::operator=
            ((shared_ptr<f8n::runtime::IMessage> *)this_00,message);
  std::chrono::duration<long,std::ratio<1l,1000l>>::duration<long,void>
            ((duration<long,std::ratio<1l,1000l>> *)&curr,&local_40);
  tVar3 = std::chrono::operator+(&local_50,(duration<long,_std::ratio<1L,_1000L>_> *)&curr);
  (local_68->time).__r = tVar3.__r;
  local_80._M_node =
       (_List_node_base *)
       std::__cxx11::
       list<f8n::runtime::MessageQueue::EnqueuedMessage_*,_std::allocator<f8n::runtime::MessageQueue::EnqueuedMessage_*>_>
       ::begin(&this->queue);
  while( true ) {
    local_88._M_node =
         (_List_node_base *)
         std::__cxx11::
         list<f8n::runtime::MessageQueue::EnqueuedMessage_*,_std::allocator<f8n::runtime::MessageQueue::EnqueuedMessage_*>_>
         ::end(&this->queue);
    bVar1 = std::operator!=(&local_80,&local_88);
    if (!bVar1) break;
    ppEVar6 = std::_List_iterator<f8n::runtime::MessageQueue::EnqueuedMessage_*>::operator*
                        (&local_80);
    bVar1 = std::chrono::operator<=(&(*ppEVar6)->time,&local_68->time);
    if (!bVar1) break;
    _Stack_90 = std::_List_iterator<f8n::runtime::MessageQueue::EnqueuedMessage_*>::operator++
                          (&local_80,0);
  }
  local_a0._M_node =
       (_List_node_base *)
       std::__cxx11::
       list<f8n::runtime::MessageQueue::EnqueuedMessage_*,_std::allocator<f8n::runtime::MessageQueue::EnqueuedMessage_*>_>
       ::begin(&this->queue);
  local_91 = std::operator==(&local_80,&local_a0);
  std::_List_const_iterator<f8n::runtime::MessageQueue::EnqueuedMessage_*>::_List_const_iterator
            (&local_a8,&local_80);
  local_b0 = (_List_node_base *)
             std::__cxx11::
             list<f8n::runtime::MessageQueue::EnqueuedMessage_*,_std::allocator<f8n::runtime::MessageQueue::EnqueuedMessage_*>_>
             ::insert(&this->queue,local_a8,&local_68);
  sVar4 = std::__cxx11::
          list<f8n::runtime::MessageQueue::EnqueuedMessage_*,_std::allocator<f8n::runtime::MessageQueue::EnqueuedMessage_*>_>
          ::size(&this->queue);
  if (sVar4 != 0) {
    paVar5 = &this->nextMessageTime;
    local_b8._M_node =
         (_List_node_base *)
         std::__cxx11::
         list<f8n::runtime::MessageQueue::EnqueuedMessage_*,_std::allocator<f8n::runtime::MessageQueue::EnqueuedMessage_*>_>
         ::begin(&this->queue);
    ppEVar6 = std::_List_iterator<f8n::runtime::MessageQueue::EnqueuedMessage_*>::operator*
                        (&local_b8);
    ___b = (MessageQueue *)
           std::chrono::duration<long,_std::ratio<1L,_1000L>_>::count(&(*ppEVar6)->time);
    local_1c = 5;
    local_10 = paVar5;
    local_20 = std::operator&(memory_order_seq_cst,__memory_order_mask);
    this_local = ___b;
    if (local_1c == 3) {
      (paVar5->super___atomic_base<long>)._M_i = (__int_type)___b;
    }
    else if (local_1c == 5) {
      LOCK();
      (paVar5->super___atomic_base<long>)._M_i = (__int_type)___b;
      UNLOCK();
    }
    else {
      (paVar5->super___atomic_base<long>)._M_i = (__int_type)___b;
    }
  }
  if ((local_91 & 1) != 0) {
    std::_V2::condition_variable_any::notify_all(&this->waitForDispatch);
  }
  return;
}

Assistant:

void MessageQueue::Enqueue(IMessagePtr message, int64_t delayMs) {
    delayMs = std::max((int64_t) 0, delayMs);

    milliseconds now = duration_cast<milliseconds>(
        system_clock::now().time_since_epoch());

    EnqueuedMessage *m = new EnqueuedMessage();
    m->message = message;
    m->time = now + milliseconds(delayMs);

    /* the queue is time ordered. start from the front of the queue, and
    work our way back until we find the correct place to insert the new one */

    typedef std::list<EnqueuedMessage*>::iterator Iterator;
    Iterator curr = this->queue.begin();

    while (curr != this->queue.end()) {
        if ((*curr)->time <= m->time) {
            curr++;
        }
        else {
            break;
        }
    }

    bool first = (curr == this->queue.begin());

    this->queue.insert(curr, m);

    if (this->queue.size()) {
        this->nextMessageTime.store((*this->queue.begin())->time.count());
    }

    if (first) {
        this->waitForDispatch.notify_all();
    }
}